

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O1

void nvrm_device_set_pb_pointer_found(gpu_object *obj,_Bool pb_pointer_found)

{
  gpu_object **ppgVar1;
  void *pvVar2;
  gpu_object *pgVar3;
  
  pgVar3 = obj;
  if (obj != (gpu_object *)0x0) {
    do {
      if (pgVar3->class_ == 0x80) goto LAB_00252ad0;
      ppgVar1 = &pgVar3->parent_object;
      pgVar3 = *ppgVar1;
    } while (*ppgVar1 != (gpu_object *)0x0);
  }
  pgVar3 = (gpu_object *)0x0;
LAB_00252ad0:
  if (pgVar3 == (gpu_object *)0x0) {
    __assert_fail("dev",
                  "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/demmt/nvrm.c"
                  ,0x115,"void nvrm_device_set_pb_pointer_found(struct gpu_object *, _Bool)");
  }
  if (pgVar3->class_ != 0x80) {
LAB_00252b11:
    demmt_abort();
  }
  pvVar2 = pgVar3->class_data;
  if (pvVar2 == (void *)0x0) {
    nvrm_get_chipset(obj);
    if (pgVar3->class_ != 0x80) goto LAB_00252b11;
    pvVar2 = pgVar3->class_data;
  }
  if (pvVar2 == (void *)0x0) {
    __assert_fail("ndev",
                  "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/demmt/nvrm.c"
                  ,0x11b,"void nvrm_device_set_pb_pointer_found(struct gpu_object *, _Bool)");
  }
  *(_Bool *)((long)pvVar2 + 8) = pb_pointer_found;
  return;
}

Assistant:

void nvrm_device_set_pb_pointer_found(struct gpu_object *obj, bool pb_pointer_found)
{
	struct gpu_object *dev = nvrm_get_device(obj);

	assert(dev);
	struct nvrm_device *ndev = nvrm_dev(dev);
	if (!ndev) {
		nvrm_get_chipset(obj);
		ndev = nvrm_dev(dev);
	}
	assert(ndev);
	ndev->pb_pointer_found = pb_pointer_found;
}